

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O0

int adjust_boost_bits_for_target_level
              (AV1_COMP *cpi,RATE_CONTROL *rc,int bits_assigned,int64_t group_bits,int frame_type)

{
  int temporal_layer_id_00;
  long lVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  int64_t in_RCX;
  int in_EDX;
  long in_RSI;
  long *in_RDI;
  int in_R8D;
  double dVar5;
  int level_enforced_max_arf_bits;
  int frames;
  int level_enforced_max_kf_bits;
  int target_bits_per_frame;
  double level_bitrate_limit;
  AV1_LEVEL target_level;
  int index;
  int spatial_layer_id;
  int temporal_layer_id;
  PRIMARY_RATE_CONTROL *p_rc;
  SequenceHeader *seq_params;
  AV1_COMMON *cm;
  int in_stack_ffffffffffffff9c;
  int in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  int local_4c;
  int local_14;
  
  lVar1 = in_RDI[0x8401];
  lVar2 = *in_RDI;
  temporal_layer_id_00 = *(int *)((long)in_RDI + 0x4230c);
  lVar3 = in_RDI[0x8462];
  local_14 = in_EDX;
  for (local_4c = 0; local_4c < *(int *)(lVar1 + 0x70) + 1; local_4c = local_4c + 1) {
    iVar4 = is_in_operating_point
                      (*(int *)(lVar1 + 0x74 + (long)local_4c * 4),temporal_layer_id_00,(int)lVar3);
    if ((iVar4 != 0) && (*(byte *)(*in_RDI + 0x5a90 + (long)local_4c) < 0x1c)) {
      dVar5 = av1_get_max_bitrate_for_level
                        ((AV1_LEVEL)((uint)in_stack_ffffffffffffffa4 >> 0x18),
                         in_stack_ffffffffffffffa0,
                         (BITSTREAM_PROFILE)((uint)in_stack_ffffffffffffff9c >> 0x18));
      in_stack_ffffffffffffffa4 = (int)(dVar5 / (double)in_RDI[0xc116]);
      if (in_R8D == 0) {
        in_stack_ffffffffffffffa0 = in_stack_ffffffffffffffa4 << 3;
        if (in_stack_ffffffffffffffa0 < local_14) {
          in_stack_ffffffffffffff9c = *(int *)(in_RSI + 0x2c) + -1;
          iVar4 = calculate_boost_factor(in_stack_ffffffffffffff9c,in_stack_ffffffffffffffa0,in_RCX)
          ;
          *(int *)(lVar2 + 0x8b38) = iVar4;
          local_14 = calculate_boost_bits(in_stack_ffffffffffffff9c,*(int *)(lVar2 + 0x8b38),in_RCX)
          ;
        }
      }
      else if ((in_R8D == 1) && (in_stack_ffffffffffffffa4 << 2 < local_14)) {
        iVar4 = calculate_boost_factor
                          (*(int *)(lVar2 + 0xac60),in_stack_ffffffffffffffa4 << 2,in_RCX);
        *(int *)(lVar2 + 0x8b3c) = iVar4;
        local_14 = calculate_boost_bits(*(int *)(lVar2 + 0xac60),*(int *)(lVar2 + 0x8b3c),in_RCX);
      }
    }
  }
  return local_14;
}

Assistant:

static int adjust_boost_bits_for_target_level(const AV1_COMP *const cpi,
                                              RATE_CONTROL *const rc,
                                              int bits_assigned,
                                              int64_t group_bits,
                                              int frame_type) {
  const AV1_COMMON *const cm = &cpi->common;
  const SequenceHeader *const seq_params = cm->seq_params;
  PRIMARY_RATE_CONTROL *const p_rc = &cpi->ppi->p_rc;
  const int temporal_layer_id = cm->temporal_layer_id;
  const int spatial_layer_id = cm->spatial_layer_id;
  for (int index = 0; index < seq_params->operating_points_cnt_minus_1 + 1;
       ++index) {
    if (!is_in_operating_point(seq_params->operating_point_idc[index],
                               temporal_layer_id, spatial_layer_id)) {
      continue;
    }

    const AV1_LEVEL target_level =
        cpi->ppi->level_params.target_seq_level_idx[index];
    if (target_level >= SEQ_LEVELS) continue;

    assert(is_valid_seq_level_idx(target_level));

    const double level_bitrate_limit = av1_get_max_bitrate_for_level(
        target_level, seq_params->tier[0], seq_params->profile);
    const int target_bits_per_frame =
        (int)(level_bitrate_limit / cpi->framerate);
    if (frame_type == 0) {
      // Maximum bits for keyframe is 8 times the target_bits_per_frame.
      const int level_enforced_max_kf_bits = target_bits_per_frame * 8;
      if (bits_assigned > level_enforced_max_kf_bits) {
        const int frames = rc->frames_to_key - 1;
        p_rc->kf_boost = calculate_boost_factor(
            frames, level_enforced_max_kf_bits, group_bits);
        bits_assigned =
            calculate_boost_bits(frames, p_rc->kf_boost, group_bits);
      }
    } else if (frame_type == 1) {
      // Maximum bits for arf is 4 times the target_bits_per_frame.
      const int level_enforced_max_arf_bits = target_bits_per_frame * 4;
      if (bits_assigned > level_enforced_max_arf_bits) {
        p_rc->gfu_boost =
            calculate_boost_factor(p_rc->baseline_gf_interval,
                                   level_enforced_max_arf_bits, group_bits);
        bits_assigned = calculate_boost_bits(p_rc->baseline_gf_interval,
                                             p_rc->gfu_boost, group_bits);
      }
    } else {
      assert(0);
    }
  }

  return bits_assigned;
}